

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O0

void Abc_ShowGetFileName(char *pName,char *pBuffer)

{
  char *local_20;
  char *pCur;
  char *pBuffer_local;
  char *pName_local;
  
  sprintf(pBuffer,"%s.dot",pName);
  for (local_20 = pBuffer; *local_20 != '\0'; local_20 = local_20 + 1) {
    if ((((*local_20 < '0') || ('9' < *local_20)) && ((*local_20 < 'a' || ('z' < *local_20)))) &&
       (((*local_20 < 'A' || ('Z' < *local_20)) && (*local_20 != '.')))) {
      *local_20 = '_';
    }
  }
  return;
}

Assistant:

void Abc_ShowGetFileName( char * pName, char * pBuffer )
{
    char * pCur;
    // creat the file name
    sprintf( pBuffer, "%s.dot", pName );
    // get rid of not-alpha-numeric characters
    for ( pCur = pBuffer; *pCur; pCur++ )
        if ( !((*pCur >= '0' && *pCur <= '9') || (*pCur >= 'a' && *pCur <= 'z') || 
               (*pCur >= 'A' && *pCur <= 'Z') || (*pCur == '.')) )
            *pCur = '_';
}